

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_text::set(xml_text *this,double rhs)

{
  bool bVar1;
  xml_node_struct *header;
  char buf [128];
  char_t local_98 [128];
  
  header = _data_new(this);
  if (header == (xml_node_struct *)0x0) {
    bVar1 = false;
  }
  else {
    sprintf(local_98,"%g",rhs);
    bVar1 = impl::anon_unknown_0::strcpy_insitu(&header->value,&header->header,8,local_98);
  }
  return bVar1;
}

Assistant:

PUGI__FN bool xml_text::set(double rhs)
	{
		xml_node_struct* dn = _data_new();

		return dn ? impl::set_value_convert(dn->value, dn->header, impl::xml_memory_page_value_allocated_mask, rhs) : false;
	}